

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beectl.c
# Opt level: O2

void print_help(void)

{
  printf("%s.\n\nVersion: %s\nCopyright: %s\nLicense: %s\n",
         "Native Messaging Host for the Bee Browser Extension <https://github.com/rosmanov/chrome-bee>"
         ,"1.3.7-3","(C) 2019-2025 Ruslan Osmanov <608192+rosmanov@users.noreply.github.com>","MIT")
  ;
  return;
}

Assistant:

static void
print_help ()
{
  printf ("%s.\n\n"
          "Version: %s\n"
          "Copyright: %s\n"
          "License: %s\n",
          PROJECT_DESCRIPTION,
          PROJECT_VERSION,
          PROJECT_COPYRIGHT,
          PROJECT_LICENSE);
}